

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::objectivec::BuildFlagsString
                   (string *__return_storage_ptr__,FlagType flag_type,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *strings)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  size_type __dnew;
  LogFinisher local_a9;
  char *local_a8;
  long local_a0;
  char local_98;
  undefined4 uStack_97;
  undefined3 uStack_93;
  undefined5 uStack_90;
  undefined1 local_8b;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  LogMessage local_68;
  
  pbVar1 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (lVar6 == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1->_M_string_length);
    return __return_storage_ptr__;
  }
  if (lVar6 == 0) {
    if (flag_type == FLAGTYPE_FIELD) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x646c656946425047;
      *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x656e6f4e;
      __return_storage_ptr__->_M_string_length = 0xc;
      (__return_storage_ptr__->field_2)._M_local_buf[0xc] = '\0';
      return __return_storage_ptr__;
    }
    if (flag_type == FLAGTYPE_EXTENSION) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_68._0_8_ = 0x10;
      pcVar3 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)&local_68);
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_68._0_8_;
      builtin_strncpy(pcVar3,"GPBExtensionNone",0x10);
      __return_storage_ptr__->_M_string_length = local_68._0_8_;
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    }
    else {
      if (flag_type != FLAGTYPE_DESCRIPTOR_INITIALIZATION) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                   ,0x14d);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"Can\'t get here.");
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined2 *)&__return_storage_ptr__->field_2 = 0x30;
        __return_storage_ptr__->_M_string_length = 1;
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_68._0_8_ = 0x24;
      pcVar3 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)&local_68);
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_68._0_8_;
      builtin_strncpy(pcVar3,"GPBDescriptorInitializationFlag_None",0x24);
      __return_storage_ptr__->_M_string_length = local_68._0_8_;
    }
    pcVar3[local_68._0_8_] = '\0';
    return __return_storage_ptr__;
  }
  if (flag_type == FLAGTYPE_FIELD) {
    local_a8 = &local_98;
    local_98 = 'G';
    uStack_97 = 0x69464250;
    uStack_93 = 0x646c65;
    uStack_90 = 0x7367616c46;
    local_a0 = 0xd;
    local_8b = 0;
  }
  else {
    if (flag_type == FLAGTYPE_EXTENSION) {
      local_a8 = &local_98;
      local_68._0_8_ = 0x13;
      local_a8 = (char *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
      local_98 = (char)local_68.level_;
      uStack_97 = local_68._1_4_;
      uStack_93 = local_68._5_3_;
      builtin_strncpy(local_a8,"GPBExtensionOptions",0x13);
    }
    else {
      if (flag_type != FLAGTYPE_DESCRIPTOR_INITIALIZATION) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                   ,0x15b);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"Can\'t get here.");
        internal::LogFinisher::operator=(&local_a9,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
        local_a8 = &local_98;
        local_a0 = 0;
        local_98 = '\0';
        goto LAB_00260e34;
      }
      local_a8 = &local_98;
      local_68._0_8_ = 0x20;
      local_a8 = (char *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
      local_98 = (char)local_68.level_;
      uStack_97 = local_68._1_4_;
      uStack_93 = local_68._5_3_;
      builtin_strncpy(local_a8,"GPBDescriptorInitializationFlags",0x20);
    }
    local_a0 = local_68._0_8_;
    local_a8[local_68._0_8_] = '\0';
  }
LAB_00260e34:
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x39cf5c);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_78 = *plVar7;
    lStack_70 = plVar5[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar7;
    local_88 = (long *)*plVar5;
  }
  local_80 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar6 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((strings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (strings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 8;
    lVar6 = 0;
    do {
      if (lVar6 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 *(ulong *)((long)(strings->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar9 + -8));
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + 0x20;
    } while (lVar6 != (long)(strings->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(strings->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string BuildFlagsString(const FlagType flag_type,
                        const std::vector<string>& strings) {
  if (strings.size() == 0) {
    return GetZeroEnumNameForFlagType(flag_type);
  } else if (strings.size() == 1) {
    return strings[0];
  }
  string string("(" + GetEnumNameForFlagType(flag_type) + ")(");
  for (size_t i = 0; i != strings.size(); ++i) {
    if (i > 0) {
      string.append(" | ");
    }
    string.append(strings[i]);
  }
  string.append(")");
  return string;
}